

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,ByteData *signature,SigHashType *sighash_type)

{
  byte bVar1;
  byte bVar2;
  SigHashAlgorithm SVar3;
  SigHashAlgorithm SVar4;
  uchar *bytes_out;
  CfdException *this;
  SigHashAlgorithm SVar5;
  SigHashAlgorithm SVar6;
  uchar *puVar7;
  value_type_conflict *__val;
  size_t written;
  SigHashType temp_sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  int ret;
  size_t local_c0;
  undefined1 local_b8 [8];
  undefined4 local_b0;
  char *local_a8 [2];
  SigHashAlgorithm local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_60 [6];
  ByteData local_48;
  
  ByteData::GetBytes(&local_78,signature);
  bytes_out = (uchar *)operator_new(0x49);
  puVar7 = bytes_out + 0x49;
  bytes_out[0x39] = '\0';
  bytes_out[0x3a] = '\0';
  bytes_out[0x3b] = '\0';
  bytes_out[0x3c] = '\0';
  bytes_out[0x3d] = '\0';
  bytes_out[0x3e] = '\0';
  bytes_out[0x3f] = '\0';
  bytes_out[0x40] = '\0';
  bytes_out[0x41] = '\0';
  bytes_out[0x42] = '\0';
  bytes_out[0x43] = '\0';
  bytes_out[0x44] = '\0';
  bytes_out[0x45] = '\0';
  bytes_out[0x46] = '\0';
  bytes_out[0x47] = '\0';
  bytes_out[0x48] = '\0';
  bytes_out[0x30] = '\0';
  bytes_out[0x31] = '\0';
  bytes_out[0x32] = '\0';
  bytes_out[0x33] = '\0';
  bytes_out[0x34] = '\0';
  bytes_out[0x35] = '\0';
  bytes_out[0x36] = '\0';
  bytes_out[0x37] = '\0';
  bytes_out[0x38] = '\0';
  bytes_out[0x39] = '\0';
  bytes_out[0x3a] = '\0';
  bytes_out[0x3b] = '\0';
  bytes_out[0x3c] = '\0';
  bytes_out[0x3d] = '\0';
  bytes_out[0x3e] = '\0';
  bytes_out[0x3f] = '\0';
  bytes_out[0x20] = '\0';
  bytes_out[0x21] = '\0';
  bytes_out[0x22] = '\0';
  bytes_out[0x23] = '\0';
  bytes_out[0x24] = '\0';
  bytes_out[0x25] = '\0';
  bytes_out[0x26] = '\0';
  bytes_out[0x27] = '\0';
  bytes_out[0x28] = '\0';
  bytes_out[0x29] = '\0';
  bytes_out[0x2a] = '\0';
  bytes_out[0x2b] = '\0';
  bytes_out[0x2c] = '\0';
  bytes_out[0x2d] = '\0';
  bytes_out[0x2e] = '\0';
  bytes_out[0x2f] = '\0';
  bytes_out[0x10] = '\0';
  bytes_out[0x11] = '\0';
  bytes_out[0x12] = '\0';
  bytes_out[0x13] = '\0';
  bytes_out[0x14] = '\0';
  bytes_out[0x15] = '\0';
  bytes_out[0x16] = '\0';
  bytes_out[0x17] = '\0';
  bytes_out[0x18] = '\0';
  bytes_out[0x19] = '\0';
  bytes_out[0x1a] = '\0';
  bytes_out[0x1b] = '\0';
  bytes_out[0x1c] = '\0';
  bytes_out[0x1d] = '\0';
  bytes_out[0x1e] = '\0';
  bytes_out[0x1f] = '\0';
  bytes_out[0] = '\0';
  bytes_out[1] = '\0';
  bytes_out[2] = '\0';
  bytes_out[3] = '\0';
  bytes_out[4] = '\0';
  bytes_out[5] = '\0';
  bytes_out[6] = '\0';
  bytes_out[7] = '\0';
  bytes_out[8] = '\0';
  bytes_out[9] = '\0';
  bytes_out[10] = '\0';
  bytes_out[0xb] = '\0';
  bytes_out[0xc] = '\0';
  bytes_out[0xd] = '\0';
  bytes_out[0xe] = '\0';
  bytes_out[0xf] = '\0';
  local_c0 = 0;
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = bytes_out;
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar7;
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar7;
  if ((ulong)((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 0x47) {
LAB_00302397:
    local_60[0] = wally_ec_sig_to_der(local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_78.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,bytes_out,
                                      (long)puVar7 - (long)bytes_out,&local_c0);
    if (local_60[0] != 0) {
      local_b8 = (undefined1  [8])0x5d3588;
      local_b0 = 0x32e;
      local_a8[0] = "ConvertSignatureToDer";
      logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                        "wally_ec_sig_to_der NG[{}].",local_60);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_b8 = (undefined1  [8])local_a8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"der encode error.","");
      CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_b8);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_c0 < 0x49) {
      local_b8 = (undefined1  [8])0x5d3588;
      local_b0 = 0x335;
      local_a8[0] = "ConvertSignatureToDer";
      SVar4 = (SigHashAlgorithm)sighash_type->kSigHashAnyOneCanPay;
      bVar1 = 0;
      if (sighash_type->is_anyone_can_pay_ == false) {
        SVar4 = kSigHashDefault;
      }
      local_94 = (SigHashAlgorithm)sighash_type->kSigHashForkId;
      if (sighash_type->is_fork_id_ == false) {
        local_94 = kSigHashDefault;
      }
      local_94 = local_94 | SVar4 | sighash_type->hash_algorithm_;
      logger::log<unsigned_long&,unsigned_int&>
                ((CfdSourceLocation *)local_b8,kCfdLogLevelInfo,"size[{}]. append[{}]",&local_c0,
                 &local_94);
      bVar2 = sighash_type->kSigHashAnyOneCanPay;
      if (sighash_type->is_anyone_can_pay_ == false) {
        bVar2 = 0;
      }
      if (sighash_type->is_fork_id_ != false) {
        bVar1 = sighash_type->kSigHashForkId;
      }
      bytes_out[local_c0] = bVar2 | (byte)sighash_type->hash_algorithm_ | bVar1;
      local_c0 = local_c0 + 1;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,local_c0);
    ByteData::ByteData(__return_storage_ptr__,&local_90);
    bytes_out = local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (uchar *)0x0) goto LAB_0030248e;
  }
  else {
    local_b8._0_3_ = 0x804040;
    local_b8._4_4_ = 1;
    local_b0 = local_b0 & 0xffff0000;
    ConvertSignatureFromDer(&local_48,signature,(SigHashType *)local_b8);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    SVar4 = (SigHashAlgorithm)sighash_type->kSigHashAnyOneCanPay;
    if (sighash_type->is_anyone_can_pay_ == false) {
      SVar4 = kSigHashDefault;
    }
    SVar5 = (SigHashAlgorithm)sighash_type->kSigHashForkId;
    if (sighash_type->is_fork_id_ == false) {
      SVar5 = kSigHashDefault;
    }
    SVar3 = (SigHashAlgorithm)local_b8[2];
    if (local_b0._0_1_ == false) {
      SVar3 = kSigHashDefault;
    }
    SVar6 = (SigHashAlgorithm)(byte)local_b8[0];
    if (local_b0._1_1_ == false) {
      SVar6 = kSigHashDefault;
    }
    if ((SVar4 | (byte)(char)sighash_type->hash_algorithm_ | SVar5) !=
        (SVar6 | SVar3 | local_b8._4_4_)) goto LAB_00302397;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               &signature->data_);
  }
  operator_delete(bytes_out);
LAB_0030248e:
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const ByteData &signature, const SigHashType &sighash_type) {
  std::vector<uint8_t> sig = signature.GetBytes();
  // Secure the size considering SigHashType(1byte).
  std::vector<uint8_t> output(EC_SIGNATURE_DER_MAX_LEN + 1);
  size_t written = 0;

  if ((output.size() - 2) <= sig.size()) {
    try {
      SigHashType temp_sighash;
      ConvertSignatureFromDer(signature, &temp_sighash);
      uint8_t flag = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
      if (flag == temp_sighash.GetSigHashFlag()) {
        return signature;
      }
    } catch (const CfdException &except) {
      info(
          CFD_LOG_SOURCE, "ConvertSignatureFromDer fail. fall through. ({})",
          std::string(except.what()));
    }
  }

  // Convert a compact signature to DER encoding.
  int ret = wally_ec_sig_to_der(
      sig.data(), sig.size(), output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_to_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der encode error.");
  }

  if (written <= EC_SIGNATURE_DER_MAX_LEN) {
    // add SigHashType
    info(
        CFD_LOG_SOURCE, "size[{}]. append[{}]", written,
        sighash_type.GetSigHashFlag());
    output[written] = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
    ++written;
  }
  output.resize(written);

  return ByteData(output);
}